

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O0

json2map_t * json2map_init(char saveSubobjectString)

{
  json2map_t *pjVar1;
  char in_DIL;
  json2map_t *obj;
  
  pjVar1 = (json2map_t *)malloc(0x18);
  pjVar1->dataMapData = (void *)0x0;
  pjVar1->dataMapHook = (_func_void_void_ptr_char_ptr_char_ptr *)0x0;
  pjVar1->saveSubobjectString = in_DIL;
  return pjVar1;
}

Assistant:

json2map_t *json2map_init(char saveSubobjectString) {
	DEBUG_PUT("json2map_init()... ");
	json2map_t *obj = (json2map_t *) malloc(sizeof(json2map_t));
	obj->dataMapData = NULL;
	obj->dataMapHook = NULL;
	obj->saveSubobjectString = saveSubobjectString;
	DEBUG_PUT("json2map_init()... DONE");
	return obj;
}